

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_effect.cpp
# Opt level: O0

particle_t * JitterParticle(int ttl,double drift)

{
  int iVar1;
  particle_t *ppVar2;
  double *pdVar3;
  int local_24;
  int i;
  particle_t *particle;
  double drift_local;
  int ttl_local;
  
  ppVar2 = NewParticle();
  if (ppVar2 != (particle_t *)0x0) {
    for (local_24 = 3; local_24 != 0; local_24 = local_24 + -1) {
      iVar1 = FRandom::operator()(&M_Random);
      pdVar3 = TVector3<double>::operator[](&ppVar2->Vel,local_24);
      *pdVar3 = (double)(iVar1 + -0x80) * 0.000244140625 * drift;
    }
    for (local_24 = 3; local_24 != 0; local_24 = local_24 + -1) {
      iVar1 = FRandom::operator()(&M_Random);
      pdVar3 = TVector3<double>::operator[](&ppVar2->Acc,local_24);
      *pdVar3 = (double)(iVar1 + -0x80) * 6.103515625e-05 * drift;
    }
    ppVar2->trans = 0xff;
    ppVar2->ttl = (BYTE)ttl;
    ppVar2->fade = (BYTE)(0xff / (long)ttl);
  }
  return ppVar2;
}

Assistant:

particle_t *JitterParticle (int ttl, double drift)
{
	particle_t *particle = NewParticle ();

	if (particle) {
		int i;

		// Set initial velocities
		for (i = 3; i; i--)
			particle->Vel[i] = ((1./4096) * (M_Random () - 128) * drift);
		// Set initial accelerations
		for (i = 3; i; i--)
			particle->Acc[i] = ((1./16384) * (M_Random () - 128) * drift);

		particle->trans = 255;	// fully opaque
		particle->ttl = ttl;
		particle->fade = FADEFROMTTL(ttl);
	}
	return particle;
}